

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.h
# Opt level: O0

int ParseArgs(int argc,char **argv,ProgramArgs *args)

{
  int iVar1;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  double dVar2;
  int argi;
  int local_1c;
  
  *in_RDX = 4;
  in_RDX[1] = 8;
  in_RDX[2] = 0;
  in_RDX[3] = 1;
  in_RDX[6] = -0x2d0e5604;
  in_RDX[7] = 0x3f50624d;
  in_RDX[4] = 0x54442d18;
  in_RDX[5] = 0x401921fb;
  local_1c = 1;
  do {
    if (in_EDI <= local_1c) {
      return 0;
    }
    iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--order");
    if (iVar1 == 0) {
      local_1c = local_1c + 1;
      iVar1 = atoi(*(char **)(in_RSI + (long)local_1c * 8));
      *in_RDX = iVar1;
    }
    else {
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--tf");
      if (iVar1 == 0) {
        local_1c = local_1c + 1;
        dVar2 = atof(*(char **)(in_RSI + (long)local_1c * 8));
        *(double *)(in_RDX + 4) = dVar2;
      }
      else {
        iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--dt");
        if (iVar1 == 0) {
          local_1c = local_1c + 1;
          dVar2 = atof(*(char **)(in_RSI + (long)local_1c * 8));
          *(double *)(in_RDX + 6) = dVar2;
        }
        else {
          iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--nout");
          if (iVar1 == 0) {
            local_1c = local_1c + 1;
            iVar1 = atoi(*(char **)(in_RSI + (long)local_1c * 8));
            in_RDX[1] = iVar1;
          }
          else {
            iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--use-compensated-sums");
            if (iVar1 == 0) {
              in_RDX[2] = 1;
            }
            else {
              iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--disable-tstop");
              if (iVar1 != 0) {
                iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--help");
                if (iVar1 == 0) {
                  PrintHelp();
                  return 1;
                }
                fprintf(_stderr,"ERROR: unrecognized argument %s\n",
                        *(undefined8 *)(in_RSI + (long)local_1c * 8));
                PrintHelp();
                return 1;
              }
              in_RDX[3] = 0;
            }
          }
        }
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static int ParseArgs(int argc, char* argv[], ProgramArgs* args)
{
  int argi = 0;

  args->order            = 4;
  args->num_output_times = 8;
  args->use_compsums     = 0;
  args->use_tstop        = 1;
  args->dt               = SUN_RCONST(1e-3);
  args->Tf               = SUN_RCONST(2.0) * PI;

  for (argi = 1; argi < argc; argi++)
  {
    if (!strcmp(argv[argi], "--order"))
    {
      argi++;
      args->order = atoi(argv[argi]);
    }
    else if (!strcmp(argv[argi], "--tf"))
    {
      argi++;
      args->Tf = atof(argv[argi]);
    }
    else if (!strcmp(argv[argi], "--dt"))
    {
      argi++;
      args->dt = atof(argv[argi]);
    }
    else if (!strcmp(argv[argi], "--nout"))
    {
      argi++;
      args->num_output_times = atoi(argv[argi]);
    }
    else if (!strcmp(argv[argi], "--use-compensated-sums"))
    {
      args->use_compsums = 1;
    }
    else if (!strcmp(argv[argi], "--disable-tstop")) { args->use_tstop = 0; }
    else if (!strcmp(argv[argi], "--help"))
    {
      PrintHelp();
      return 1;
    }
    else
    {
      fprintf(stderr, "ERROR: unrecognized argument %s\n", argv[argi]);
      PrintHelp();
      return 1;
    }
  }

  return 0;
}